

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functions.c
# Opt level: O1

double Jupiter_strtod_nospace_s(char *str,size_t length)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  if (length == 0) {
    dVar6 = 0.0;
  }
  else {
    if (*str == '+') {
      str = str + 1;
      length = length - 1;
    }
    else if (*str == '-') {
      dVar6 = Jupiter_strtod_nospace_s(str + 1,length - 1);
      return -dVar6;
    }
    dVar6 = 0.0;
    bVar1 = *str;
    while (0xfffffffffffffff5 < (ulong)bVar1 - 0x3a) {
      dVar6 = dVar6 * 10.0 +
              (double)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                      [bVar1];
      if (length == 1) {
        return dVar6;
      }
      pbVar3 = (byte *)str + 1;
      str = (char *)((byte *)str + 1);
      length = length - 1;
      bVar1 = *pbVar3;
    }
    if (bVar1 == 0x2e) {
      pbVar3 = (byte *)str + 1;
      lVar4 = length - 1;
      if ((lVar4 != 0) && (uVar5 = (ulong)*pbVar3, 0xfffffffffffffff5 < uVar5 - 0x3a)) {
        iVar2 = 10;
        do {
          str = (char *)pbVar3;
          dVar6 = (double)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                          [uVar5] / (double)iVar2 + dVar6;
          if (lVar4 == 1) {
            return dVar6;
          }
          iVar2 = iVar2 * 10;
          uVar5 = (ulong)((byte *)str)[1];
          pbVar3 = (byte *)str + 1;
          lVar4 = lVar4 + -1;
        } while (0xfffffffffffffff5 < uVar5 - 0x3a);
      }
      if ((*pbVar3 | 0x20) == 0x65) {
        iVar2 = Jupiter_strtoi_nospace_s((char *)((byte *)str + 2),lVar4 - 1,10);
        dVar7 = pow(10.0,(double)iVar2);
        dVar6 = dVar6 * dVar7;
      }
    }
  }
  return dVar6;
}

Assistant:

double Jupiter_strtod_nospace_s(const char *str, size_t length)
{
	const int base = 10;
	double total = 0.0;
	double decimal = 0.0;
	int tval;

	if (length == 0)
		return 0;

	if (*str == '-')
		return -1 * Jupiter_strtod_nospace_s(++str, --length);

	if (*str == '+')
		++str, --length;

	while ((tval = Jupiter_getBase(*str, base)) != -1)
	{
		total = base * total + tval;
		if (--length == 0)
			return total;
		++str;
	}

	if (*str == '.')
	{
		++str;
		--length;

		tval = base;
		while (length != 0 && (decimal = Jupiter_getBase(*str, base)) != -1)
		{
			total = total + (decimal / tval);
			if (--length == 0)
				return total;
			++str;
			tval = tval * base;
		}
		if (*str == 'e' || *str == 'E')
			total = total * pow(base, Jupiter_strtoi_nospace_s(++str, --length, 10));
	}

	return total;
}